

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> * __thiscall
args::Matcher::GetFlagStrings
          (vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *__return_storage_ptr__,
          Matcher *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  reference __args;
  string *flag_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  _Node_iterator_base<char,_false> _Stack_48;
  char flag;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *__range2;
  Matcher *this_local;
  vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> *flagStrings;
  
  std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::vector(__return_storage_ptr__);
  sVar2 = std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
          size(&this->shortFlags);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->longFlags);
  std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::reserve
            (__return_storage_ptr__,sVar2 + sVar3);
  __end2 = std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
           begin(&this->shortFlags);
  _Stack_48._M_cur =
       (__node_type *)
       std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::end
                 (&this->shortFlags);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<char,_false>,&stack0xffffffffffffffb8)
        , bVar1) {
    pvVar4 = std::__detail::_Node_const_iterator<char,_true,_false>::operator*(&__end2);
    __range2_1._7_1_ = *pvVar4;
    std::vector<args::EitherFlag,std::allocator<args::EitherFlag>>::emplace_back<char_const&>
              ((vector<args::EitherFlag,std::allocator<args::EitherFlag>> *)__return_storage_ptr__,
               (char *)((long)&__range2_1 + 7));
    std::__detail::_Node_const_iterator<char,_true,_false>::operator++(&__end2);
  }
  __end2_1 = std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->longFlags);
  flag_1 = (string *)
           std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->longFlags);
  while (bVar1 = std::__detail::operator!=
                           (&__end2_1.
                             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ,(_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)&flag_1), bVar1) {
    __args = std::__detail::
             _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
             ::operator*(&__end2_1);
    std::vector<args::EitherFlag,std::allocator<args::EitherFlag>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<args::EitherFlag,std::allocator<args::EitherFlag>> *)__return_storage_ptr__,
               __args);
    std::__detail::
    _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++(&__end2_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<EitherFlag> GetFlagStrings() const
            {
                std::vector<EitherFlag> flagStrings;
                flagStrings.reserve(shortFlags.size() + longFlags.size());
                for (const char flag: shortFlags)
                {
                    flagStrings.emplace_back(flag);
                }
                for (const std::string &flag: longFlags)
                {
                    flagStrings.emplace_back(flag);
                }
                return flagStrings;
            }